

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
gulps::message::message
          (message *this,level lvl,char *major,char *minor,char *path,int64_t line,string *text,
          color clr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  time_t tVar5;
  long in_FS_OFFSET;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  tVar5 = time((time_t *)0x0);
  this->time = tVar5;
  this->lvl = lvl;
  std::__cxx11::string::string((string *)&this->cat_major,major,&local_31);
  std::__cxx11::string::string((string *)&this->cat_minor,minor,&local_32);
  std::__cxx11::string::string((string *)&this->src_path,path,&local_33);
  this->src_line = line;
  if (inst()::inst == '\0') {
    gulps::message();
  }
  if (*(char *)(in_FS_OFFSET + -8) == '\0') {
    gulps::message();
  }
  (this->thread_id)._M_dataplus._M_p = (pointer)&(this->thread_id).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->thread_id,*(long *)(in_FS_OFFSET + -0x28),
             *(long *)(in_FS_OFFSET + -0x20) + *(long *)(in_FS_OFFSET + -0x28));
  paVar2 = &(this->text).field_2;
  (this->text)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (text->_M_dataplus)._M_p;
  paVar1 = &text->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&text->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->text).field_2 + 8) = uVar4;
  }
  else {
    (this->text)._M_dataplus._M_p = pcVar3;
    (this->text).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->text)._M_string_length = text->_M_string_length;
  (text->_M_dataplus)._M_p = (pointer)paVar1;
  text->_M_string_length = 0;
  (text->field_2)._M_local_buf[0] = '\0';
  this->clr = clr;
  return;
}

Assistant:

message(level lvl, const char* major, const char* minor, const char* path, int64_t line, std::string&& text, fmt::color clr = fmt::color::white) : 
			time(std::time(nullptr)), lvl(lvl), cat_major(major), cat_minor(minor), src_path(path), src_line(line),
			thread_id(gulps::inst().get_thread_tag()), text(std::move(text)), clr(clr)
		{
		}